

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  leaf_t leaf;
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  leaf_t result_leaf_1;
  leaf_t result_leaf;
  container_t *result_container;
  uint8_t result_typecode;
  leaf_t leaf2;
  leaf_t *leaf1;
  int compare_result;
  _Bool it2_present;
  art_iterator_t it2;
  art_iterator_t it1;
  roaring64_bitmap_t *result;
  art_key_chunk_t *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  uint8_t in_stack_fffffffffffffe87;
  roaring64_bitmap_t *in_stack_fffffffffffffe88;
  roaring64_bitmap_t *in_stack_fffffffffffffe90;
  container_t *in_stack_fffffffffffffe98;
  container_t *in_stack_fffffffffffffea0;
  uint8_t type1;
  container_t *in_stack_fffffffffffffea8;
  undefined4 local_140;
  undefined8 local_130;
  undefined8 local_a0;
  
  prVar2 = roaring64_bitmap_create();
  art_init_iterator(&in_stack_fffffffffffffe90->art,
                    SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0));
  art_init_iterator(&in_stack_fffffffffffffe90->art,
                    SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0));
  while (local_a0 != (leaf_t *)0x0) {
    local_140 = 0;
    if (local_130 != (leaf_t *)0x0) {
      local_140 = compare_high48((art_key_chunk_t *)
                                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe78);
      type1 = (uint8_t)((ulong)in_stack_fffffffffffffea0 >> 0x38);
      if (local_140 == 0) {
        leaf = *local_130;
        in_stack_fffffffffffffe78 =
             (art_key_chunk_t *)
             get_container((roaring64_bitmap_t *)
                           CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           (leaf_t)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe87 = get_typecode(*local_a0);
        in_stack_fffffffffffffe88 =
             (roaring64_bitmap_t *)
             get_container((roaring64_bitmap_t *)
                           CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           (leaf_t)in_stack_fffffffffffffe78);
        get_typecode(leaf);
        in_stack_fffffffffffffea0 =
             container_andnot(in_stack_fffffffffffffea8,type1,in_stack_fffffffffffffe98,
                              (uint8_t)((ulong)in_stack_fffffffffffffe90 >> 0x38),
                              (uint8_t *)in_stack_fffffffffffffe88);
        _Var1 = container_nonzero_cardinality(in_stack_fffffffffffffe78,'\0');
        if (_Var1) {
          in_stack_fffffffffffffe98 =
               (container_t *)
               add_container(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                             in_stack_fffffffffffffe87);
          art_insert(&in_stack_fffffffffffffe88->art,
                     (art_key_chunk_t *)
                     CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (art_val_t)in_stack_fffffffffffffe78);
        }
        else {
          container_free((container_t *)
                         CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                         (uint8_t)((ulong)in_stack_fffffffffffffe78 >> 0x38));
        }
        art_iterator_next((art_iterator_t *)0x1408a7);
        art_iterator_next((art_iterator_t *)0x1408b1);
      }
    }
    if ((local_130 != (leaf_t *)0x0) && (-1 < local_140)) {
      if (0 < local_140) {
        art_iterator_next((art_iterator_t *)0x140920);
      }
    }
    else {
      in_stack_fffffffffffffe90 =
           (roaring64_bitmap_t *)
           copy_leaf_container(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      art_insert(&in_stack_fffffffffffffe88->art,
                 (art_key_chunk_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (art_val_t)in_stack_fffffffffffffe78);
      art_iterator_next((art_iterator_t *)0x14090d);
    }
  }
  return prVar2;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container = container_andnot(
                    get_container(r1, *leaf1), get_typecode(*leaf1),
                    get_container(r2, leaf2), get_typecode(leaf2),
                    &result_typecode);

                if (container_nonzero_cardinality(result_container,
                                                  result_typecode)) {
                    leaf_t result_leaf = add_container(result, result_container,
                                                       result_typecode);
                    art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                } else {
                    container_free(result_container, result_typecode);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}